

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioApi.c
# Opt level: O0

Mio_Gate_t * Mio_LibraryReadGateByName(Mio_Library_t *pLib,char *pName,char *pOutName)

{
  int iVar1;
  Mio_Library_t *local_30;
  Mio_Gate_t *pGate;
  char *pOutName_local;
  char *pName_local;
  Mio_Library_t *pLib_local;
  
  pGate = (Mio_Gate_t *)pOutName;
  pOutName_local = pName;
  pName_local = (char *)pLib;
  iVar1 = st__lookup(pLib->tName2Gate,pName,(char **)&local_30);
  if (iVar1 == 0) {
    pLib_local = (Mio_Library_t *)0x0;
  }
  else if (pGate == (Mio_Gate_t *)0x0) {
    pLib_local = local_30;
  }
  else {
    iVar1 = strcmp((char *)local_30->pGates,(char *)pGate);
    if (iVar1 == 0) {
      pLib_local = local_30;
    }
    else {
      if ((local_30->pGateBuf != (Mio_Gate_t *)0x0) &&
         (iVar1 = strcmp(local_30->pGateBuf->pOutName,(char *)pGate), iVar1 == 0)) {
        return local_30->pGateBuf;
      }
      pLib_local = (Mio_Library_t *)0x0;
    }
  }
  return (Mio_Gate_t *)pLib_local;
}

Assistant:

Mio_Gate_t * Mio_LibraryReadGateByName( Mio_Library_t * pLib, char * pName, char * pOutName )      
{ 
    Mio_Gate_t * pGate;
    if ( ! st__lookup( pLib->tName2Gate, pName, (char **)&pGate ) )
        return NULL;
    if ( pOutName == NULL )
        return pGate;
    if ( !strcmp(pGate->pOutName, pOutName) )
        return pGate;
    if ( pGate->pTwin && !strcmp(pGate->pTwin->pOutName, pOutName) )
        return pGate->pTwin;
    return NULL;
}